

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPrivate::cleanupPagesNotInHistory(QWizardPrivate *this)

{
  long lVar1;
  _Rb_tree_color *p_Var2;
  long *plVar3;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar4;
  _Base_ptr p_Var5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  
  plVar3 = *(long **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QMap<int,_QWizardPage_*>::detach(&this->pageMap);
  p_Var7 = *(_Base_ptr *)
            ((long)&(((this->pageMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header +
            0x10);
  QMap<int,_QWizardPage_*>::detach(&this->pageMap);
  pQVar4 = (this->pageMap).d.d.ptr;
  do {
    if ((_Rb_tree_header *)p_Var7 == &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    p_Var5 = (p_Var7[1]._M_parent)->_M_parent;
    if (*(char *)((long)&p_Var5[0x18]._M_parent + 6) == '\x01') {
      lVar6 = (this->history).d.size;
      if (lVar6 != 0) {
        lVar8 = 0;
        do {
          if (lVar6 << 2 == lVar8) goto LAB_00509f29;
          lVar1 = lVar8 + 4;
          p_Var2 = (_Rb_tree_color *)((long)(this->history).d.ptr + lVar8);
          lVar8 = lVar1;
        } while (*p_Var2 != p_Var7[1]._M_color);
        if (lVar1 != 0) goto LAB_00509f3d;
      }
LAB_00509f29:
      (**(code **)(*plVar3 + 0x1e0))(plVar3);
      *(undefined1 *)((long)&p_Var5[0x18]._M_parent + 6) = 0;
    }
LAB_00509f3d:
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void QWizardPrivate::cleanupPagesNotInHistory()
{
    Q_Q(QWizard);

    for (auto it = pageMap.begin(), end = pageMap.end(); it != end; ++it) {
        const auto idx = it.key();
        const auto page = it.value()->d_func();
        if (page->initialized && !history.contains(idx)) {
            q->cleanupPage(idx);
            page->initialized = false;
        }
    }
}